

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::ValuePlusArgsFunction::~ValuePlusArgsFunction(ValuePlusArgsFunction *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~ValuePlusArgsFunction((ValuePlusArgsFunction *)0x97b228);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

ValuePlusArgsFunction() :
        SystemSubroutine(KnownSystemName::ValuePlusArgs, SubroutineKind::Function) {
        hasOutputArgs = true;
    }